

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::~IfcLightSourcePositional
          (IfcLightSourcePositional *this,void **vtt)

{
  void **vtt_local;
  IfcLightSourcePositional *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourcePositional,_5UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourcePositional,_5UL> *)
             &(this->super_IfcLightSource).field_0x80,vtt + 0x10);
  IfcLightSource::~IfcLightSource(&this->super_IfcLightSource,vtt + 1);
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}